

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TasmanianSparseGrid.hpp
# Opt level: O0

vector<double,_std::allocator<double>_> * __thiscall
TasGrid::TasmanianSparseGrid::integrate
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,TasmanianSparseGrid *this
          )

{
  TasmanianSparseGrid *this_local;
  vector<double,_std::allocator<double>_> *result;
  
  std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__);
  TasGrid::TasmanianSparseGrid::integrate((vector *)this);
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> integrate() const{
        std::vector<double> result;
        integrate(result);
        return result;
    }